

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.hpp
# Opt level: O0

unsigned_long duckdb::Cast::Operation<duckdb::date_t,unsigned_long>(date_t input)

{
  bool bVar1;
  string *msg;
  undefined4 in_EDI;
  date_t unaff_retaddr;
  unsigned_long result;
  date_t in_stack_000001ac;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 uVar2;
  undefined4 in_stack_ffffffffffffffb4;
  undefined7 local_10;
  undefined1 in_stack_fffffffffffffff7;
  undefined4 in_stack_fffffffffffffff8;
  
  bVar1 = TryCast::Operation<duckdb::date_t,unsigned_long>
                    (unaff_retaddr,(unsigned_long *)CONCAT44(in_EDI,in_stack_fffffffffffffff8),
                     (bool)in_stack_fffffffffffffff7);
  if (!bVar1) {
    uVar2 = CONCAT13(1,(int3)in_stack_ffffffffffffffb0);
    msg = (string *)__cxa_allocate_exception(0x10);
    CastExceptionText<duckdb::date_t,unsigned_long>(in_stack_000001ac);
    InvalidInputException::InvalidInputException
              ((InvalidInputException *)CONCAT44(in_stack_ffffffffffffffb4,uVar2),msg);
    __cxa_throw(msg,&InvalidInputException::typeinfo,InvalidInputException::~InvalidInputException);
  }
  return CONCAT17(in_stack_fffffffffffffff7,local_10);
}

Assistant:

static inline DST Operation(SRC input) {
		DST result;
		if (!TryCast::Operation(input, result)) {
			throw InvalidInputException(CastExceptionText<SRC, DST>(input));
		}
		return result;
	}